

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EmissionSystem::Encode(EmissionSystem *this,KDataStream *stream)

{
  pointer pEVar1;
  pointer pEVar2;
  
  KDataStream::Write(stream,this->m_ui8SystemDataLength);
  KDataStream::Write(stream,this->m_ui8NumberOfBeams);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  (*(this->m_EmitterSystemRecord).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EmitterSystemRecord,stream);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Location,stream);
  pEVar1 = (this->m_vEmitterBeams).
           super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (this->m_vEmitterBeams).
                super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    (*(pEVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar2,stream);
  }
  return;
}

Assistant:

void EmissionSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui8SystemDataLength
           << m_ui8NumberOfBeams
           << m_ui16Padding
           << KDIS_STREAM m_EmitterSystemRecord
           << KDIS_STREAM m_Location;

    vector<EmitterBeam>::const_iterator citr = m_vEmitterBeams.begin();
    vector<EmitterBeam>::const_iterator citrEnd = m_vEmitterBeams.end();

    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}